

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.hpp
# Opt level: O2

ostream * just::console::impl::operator<<(ostream *o_,color<void> c_)

{
  char *pcVar1;
  
  if (color<void>::black == c_._id) {
    pcVar1 = "black";
  }
  else if (color<void>::red == c_._id) {
    pcVar1 = "red";
  }
  else if (color<void>::green == c_._id) {
    pcVar1 = "green";
  }
  else if (color<void>::yellow == c_._id) {
    pcVar1 = "yellow";
  }
  else if (color<void>::blue == c_._id) {
    pcVar1 = "blue";
  }
  else if (color<void>::magenta == c_._id) {
    pcVar1 = "magenta";
  }
  else if (color<void>::cyan == c_._id) {
    pcVar1 = "cyan";
  }
  else if (color<void>::gray == c_._id) {
    pcVar1 = "gray";
  }
  else if (color<void>::bright_red == c_._id) {
    pcVar1 = "bright_red";
  }
  else if (color<void>::bright_green == c_._id) {
    pcVar1 = "bright_green";
  }
  else if (color<void>::bright_yellow == c_._id) {
    pcVar1 = "bright_yellow";
  }
  else if (color<void>::bright_blue == c_._id) {
    pcVar1 = "bright_blue";
  }
  else if (color<void>::bright_magenta == c_._id) {
    pcVar1 = "bright_magenta";
  }
  else if (color<void>::bright_cyan == c_._id) {
    pcVar1 = "bright_cyan";
  }
  else {
    if (color<void>::white != c_._id) {
      __assert_fail("!\"Invalid color value\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/sabel83[P]just/include/just/console.hpp"
                    ,0x54,
                    "std::ostream &just::console::impl::operator<<(std::ostream &, color<T>) [T = void]"
                   );
    }
    pcVar1 = "white";
  }
  std::operator<<(o_,pcVar1);
  return o_;
}

Assistant:

std::ostream& operator<<(std::ostream& o_, color<T> c_)
      {
             if (c_ == color<T>::black)          { o_ << "black"; }
        else if (c_ == color<T>::red)            { o_ << "red"; }
        else if (c_ == color<T>::green)          { o_ << "green"; }
        else if (c_ == color<T>::yellow)         { o_ << "yellow"; }
        else if (c_ == color<T>::blue)           { o_ << "blue"; }
        else if (c_ == color<T>::magenta)        { o_ << "magenta"; }
        else if (c_ == color<T>::cyan)           { o_ << "cyan"; }
        else if (c_ == color<T>::gray)           { o_ << "gray"; }
        else if (c_ == color<T>::bright_red)     { o_ << "bright_red"; }
        else if (c_ == color<T>::bright_green)   { o_ << "bright_green"; }
        else if (c_ == color<T>::bright_yellow)  { o_ << "bright_yellow"; }
        else if (c_ == color<T>::bright_blue)    { o_ << "bright_blue"; }
        else if (c_ == color<T>::bright_magenta) { o_ << "bright_magenta"; }
        else if (c_ == color<T>::bright_cyan)    { o_ << "bright_cyan"; }
        else if (c_ == color<T>::white)          { o_ << "white"; }
        else { assert(!"Invalid color value"); }
  
        return o_;
      }